

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O0

string * __thiscall
flatbuffers::lobster::LobsterGenerator::GenTypeBasic_abi_cxx11_
          (string *__return_storage_ptr__,LobsterGenerator *this,Type *type)

{
  char *__s;
  allocator<char> local_21;
  Type *local_20;
  Type *type_local;
  LobsterGenerator *this_local;
  
  __s = GenTypeBasic::ctypename[type->base_type];
  local_20 = type;
  type_local = (Type *)this;
  this_local = (LobsterGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_21)
  ;
  std::allocator<char>::~allocator(&local_21);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeBasic(const Type &type) {
    // clang-format off
    static const char *ctypename[] = {
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, \
              CTYPE, JTYPE, GTYPE, NTYPE, PTYPE, ...) \
        #PTYPE,
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
    };
    // clang-format on
    return ctypename[type.base_type];
  }